

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O2

Class ownerForMethod(Class cls,SEL sel)

{
  objc_slot2 *poVar1;
  objc_slot2 *poVar2;
  Class poVar3;
  
  while (((poVar1 = objc_get_slot2(cls,sel,(uint64_t *)0x0), poVar3 = (Class)0x0,
          poVar1 != (objc_slot2 *)0x0 && (poVar3 = cls, cls->super_class != (Class)0x0)) &&
         (poVar2 = objc_get_slot2(cls->super_class,sel,(uint64_t *)0x0), poVar2 == poVar1))) {
    cls = cls->super_class;
  }
  return poVar3;
}

Assistant:

static Class ownerForMethod(Class cls, SEL sel)
{
	struct objc_slot2 *slot = objc_get_slot2(cls, sel, NULL);
	if (slot == NULL)
	{
		return Nil;
	}
	if (cls->super_class == NULL)
	{
		return cls;
	}
	if (objc_get_slot2(cls->super_class, sel, NULL) == slot)
	{
		return ownerForMethod(cls->super_class, sel);
	}
	return cls;
}